

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

config_value * config_value_create_number(intmax_t number)

{
  config_value *pcVar1;
  
  pcVar1 = (config_value *)malloc(0x10);
  if (pcVar1 == (config_value *)0x0) {
    pcVar1 = (config_value *)0x0;
  }
  else {
    pcVar1->type = NUMBER;
    (pcVar1->data).number = number;
  }
  return pcVar1;
}

Assistant:

struct config_value *config_value_create_number(intmax_t number)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = NUMBER;
        value->data.number = number;

        return value;
}